

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O3

void png_write_PLTE(png_structrp png_ptr,png_const_colorp palette,png_uint_32 num_pal)

{
  undefined8 in_RAX;
  char *warning_message;
  png_byte buf [3];
  undefined8 uStack_28;
  
  if (png_ptr->color_type == 3) {
    if (((png_ptr->mng_features_permitted & 1) == 0 && num_pal == 0) ||
       ((uint)(1 << (png_ptr->bit_depth & 0x1f)) < num_pal)) {
      png_error(png_ptr,"Invalid number of colors in palette");
    }
LAB_002d23e7:
    png_ptr->num_palette = (png_uint_16)num_pal;
    uStack_28 = in_RAX;
    png_write_chunk_header(png_ptr,0x504c5445,num_pal * 3);
    if (num_pal != 0) {
      do {
        uStack_28 = CONCAT17(palette->blue,
                             CONCAT16(palette->green,CONCAT15(palette->red,(undefined5)uStack_28)));
        png_write_chunk_data(png_ptr,(png_const_bytep)((long)&uStack_28 + 5),3);
        palette = palette + 1;
        num_pal = num_pal - 1;
      } while (num_pal != 0);
    }
    png_write_chunk_end(png_ptr);
    *(byte *)&png_ptr->mode = (byte)png_ptr->mode | 2;
    return;
  }
  if ((num_pal < 0x101) && ((png_ptr->mng_features_permitted & 1) != 0 || num_pal != 0)) {
    if ((png_ptr->color_type & 2) != 0) goto LAB_002d23e7;
    warning_message = "Ignoring request to write a PLTE chunk in grayscale PNG";
  }
  else {
    warning_message = "Invalid number of colors in palette";
  }
  png_warning(png_ptr,warning_message);
  return;
}

Assistant:

void /* PRIVATE */
png_write_PLTE(png_structrp png_ptr, png_const_colorp palette,
    png_uint_32 num_pal)
{
   png_uint_32 max_palette_length, i;
   png_const_colorp pal_ptr;
   png_byte buf[3];

   png_debug(1, "in png_write_PLTE");

   max_palette_length = (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE) ?
      (1 << png_ptr->bit_depth) : PNG_MAX_PALETTE_LENGTH;

   if ((
#ifdef PNG_MNG_FEATURES_SUPPORTED
       (png_ptr->mng_features_permitted & PNG_FLAG_MNG_EMPTY_PLTE) == 0 &&
#endif
       num_pal == 0) || num_pal > max_palette_length)
   {
      if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
      {
         png_error(png_ptr, "Invalid number of colors in palette");
      }

      else
      {
         png_warning(png_ptr, "Invalid number of colors in palette");
         return;
      }
   }

   if ((png_ptr->color_type & PNG_COLOR_MASK_COLOR) == 0)
   {
      png_warning(png_ptr,
          "Ignoring request to write a PLTE chunk in grayscale PNG");

      return;
   }

   png_ptr->num_palette = (png_uint_16)num_pal;
   png_debug1(3, "num_palette = %d", png_ptr->num_palette);

   png_write_chunk_header(png_ptr, png_PLTE, (png_uint_32)(num_pal * 3));
#ifdef PNG_POINTER_INDEXING_SUPPORTED

   for (i = 0, pal_ptr = palette; i < num_pal; i++, pal_ptr++)
   {
      buf[0] = pal_ptr->red;
      buf[1] = pal_ptr->green;
      buf[2] = pal_ptr->blue;
      png_write_chunk_data(png_ptr, buf, (png_size_t)3);
   }

#else
   /* This is a little slower but some buggy compilers need to do this
    * instead
    */
   pal_ptr=palette;

   for (i = 0; i < num_pal; i++)
   {
      buf[0] = pal_ptr[i].red;
      buf[1] = pal_ptr[i].green;
      buf[2] = pal_ptr[i].blue;
      png_write_chunk_data(png_ptr, buf, (png_size_t)3);
   }

#endif
   png_write_chunk_end(png_ptr);
   png_ptr->mode |= PNG_HAVE_PLTE;
}